

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<double> __thiscall
qclab::dense::operator+(dense *this,SquareMatrix<double> *lhs,SquareMatrix<double> *rhs)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  data_type extraout_RDX;
  double *pdVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  SquareMatrix<double> SVar7;
  
  lVar1 = rhs->size_;
  lVar2 = lhs->size_;
  if (lVar1 == lVar2) {
    if (0 < lVar2) {
      pdVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      pdVar4 = (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      lVar5 = 0;
      do {
        lVar6 = 0;
        do {
          pdVar4[lVar6] = pdVar3[lVar6] + pdVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
        lVar5 = lVar5 + 1;
        pdVar4 = pdVar4 + lVar2;
        pdVar3 = pdVar3 + lVar1;
      } while (lVar5 != lVar2);
    }
    SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,lhs);
    SVar7.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    SVar7.size_ = (size_type_conflict)this;
    return SVar7;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x98,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator+=(const SquareMatrix<T> &) [T = double]"
               );
}

Assistant:

inline int64_t size() const { return size_ ; }